

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_midi_timidity.cpp
# Opt level: O0

void __thiscall TimidityPPMIDIDevice::TimidityPPMIDIDevice(TimidityPPMIDIDevice *this,char *args)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  char *local_18;
  char *args_local;
  TimidityPPMIDIDevice *this_local;
  
  PseudoMIDIDevice::PseudoMIDIDevice(&this->super_PseudoMIDIDevice);
  (this->super_PseudoMIDIDevice).super_MIDIDevice._vptr_MIDIDevice =
       (_func_int **)&PTR__TimidityPPMIDIDevice_009f0a90;
  FTempFileName::FTempFileName(&this->DiskName,"zmid");
  this->ChildProcess = -1;
  FString::FString(&this->CommandLine);
  this->WavePipe[1] = -1;
  this->WavePipe[0] = -1;
  if ((args == (char *)0x0) || (local_18 = args, *args == '\0')) {
    local_18 = FStringCVar::operator_cast_to_char_(&timidity_exe);
  }
  pcVar2 = FStringCVar::operator*(&timidity_extargs);
  pcVar3 = FStringCVar::operator*(&timidity_chorus);
  pcVar4 = FStringCVar::operator*(&timidity_reverb);
  iVar1 = FIntCVar::operator*(&timidity_frequency);
  FString::Format(&this->CommandLine,"%s %s -EFchorus=%s -EFreverb=%s -s%d ",local_18,pcVar2,pcVar3,
                  pcVar4,iVar1);
  pcVar2 = FTempFileName::operator_cast_to_char_(&this->DiskName);
  if (pcVar2 == (char *)0x0) {
    Printf(200,"Could not create temp music file\n");
  }
  return;
}

Assistant:

TimidityPPMIDIDevice::TimidityPPMIDIDevice(const char *args)
	: DiskName("zmid"),
#ifdef _WIN32
	  ReadWavePipe(INVALID_HANDLE_VALUE), WriteWavePipe(INVALID_HANDLE_VALUE),
	  ChildProcess(INVALID_HANDLE_VALUE),
	  Validated(false)
#else
	  ChildProcess(-1)
#endif
{
#ifndef _WIN32
	WavePipe[0] = WavePipe[1] = -1;
#endif

	if (args == NULL || *args == 0) args = timidity_exe;

	CommandLine.Format("%s %s -EFchorus=%s -EFreverb=%s -s%d ",
		args, *timidity_extargs,
		*timidity_chorus, *timidity_reverb, *timidity_frequency);

	if (DiskName == NULL)
	{
		Printf(PRINT_BOLD, "Could not create temp music file\n");
		return;
	}
}